

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

Window * __thiscall
s2polyline_alignment::Window::Upsample
          (Window *__return_storage_ptr__,Window *this,int new_rows,int new_cols)

{
  allocator<s2polyline_alignment::ColumnStride> *this_00;
  int iVar1;
  value_type vVar2;
  ostream *poVar3;
  size_type __n;
  const_reference pvVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  int local_a0;
  int iStack_9c;
  int row;
  ColumnStride from_stride;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  double col_scale;
  double row_scale;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  int local_20;
  int local_1c;
  int new_cols_local;
  int new_rows_local;
  Window *this_local;
  
  local_39 = 0;
  local_20 = new_cols;
  local_1c = new_rows;
  _new_cols_local = this;
  this_local = __return_storage_ptr__;
  if (new_rows < this->rows_) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x46,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar3 = S2LogMessage::stream(&local_38);
    poVar3 = std::operator<<(poVar3,"Check failed: new_rows >= rows_ ");
    poVar3 = std::operator<<(poVar3,"Upsampling: New_rows < current_rows");
    S2LogMessageVoidify::operator&(&local_21,poVar3);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  if (local_20 < this->cols_) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x47,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_60);
    poVar3 = std::operator<<(poVar3,"Check failed: new_cols >= cols_ ");
    poVar3 = std::operator<<(poVar3,"Upsampling: New_cols < current_cols");
    S2LogMessageVoidify::operator&(local_4d,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  dVar6 = (double)local_1c;
  iVar1 = this->rows_;
  dVar7 = (double)local_20 / (double)this->cols_;
  __n = (size_type)local_1c;
  this_00 = (allocator<s2polyline_alignment::ColumnStride> *)((long)&from_stride.start + 3);
  std::allocator<s2polyline_alignment::ColumnStride>::allocator(this_00);
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  vector((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          *)&from_stride.end,__n,this_00);
  std::allocator<s2polyline_alignment::ColumnStride>::~allocator
            ((allocator<s2polyline_alignment::ColumnStride> *)((long)&from_stride.start + 3));
  for (local_a0 = 0; local_a0 < local_1c; local_a0 = local_a0 + 1) {
    pvVar4 = std::
             vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ::operator[](&this->strides_,
                          (long)(int)(((double)local_a0 + 0.5) / (dVar6 / (double)iVar1)));
    iStack_9c = (*pvVar4).start;
    row = (*pvVar4).end;
    pvVar5 = std::
             vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ::operator[]((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                           *)&from_stride.end,(long)local_a0);
    vVar2.end = (int)(dVar7 * (double)row + 0.5);
    vVar2.start = (int)(dVar7 * (double)iStack_9c + 0.5);
    *pvVar5 = vVar2;
  }
  Window(__return_storage_ptr__,
         (vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          *)&from_stride.end);
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  ~vector((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
           *)&from_stride.end);
  return __return_storage_ptr__;
}

Assistant:

Window Window::Upsample(const int new_rows, const int new_cols) const {
  S2_DCHECK(new_rows >= rows_) << "Upsampling: New_rows < current_rows";
  S2_DCHECK(new_cols >= cols_) << "Upsampling: New_cols < current_cols";
  const double row_scale = static_cast<double>(new_rows) / rows_;
  const double col_scale = static_cast<double>(new_cols) / cols_;
  std::vector<ColumnStride> new_strides(new_rows);
  ColumnStride from_stride;
  for (int row = 0; row < new_rows; ++row) {
    from_stride = strides_[static_cast<int>((row + 0.5) / row_scale)];
    new_strides[row] = {static_cast<int>(col_scale * from_stride.start + 0.5),
                        static_cast<int>(col_scale * from_stride.end + 0.5)};
  }
  return Window(new_strides);
}